

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.h
# Opt level: O0

pair<llvm::SmallPtrSetIterator<llvm::cl::Option_*>,_bool> * __thiscall
llvm::SmallPtrSetImpl<llvm::cl::Option_*>::insert
          (pair<llvm::SmallPtrSetIterator<llvm::cl::Option_*>,_bool> *__return_storage_ptr__,
          SmallPtrSetImpl<llvm::cl::Option_*> *this,Option *Ptr)

{
  void *Ptr_00;
  pair<const_void_*const_*,_bool> pVar1;
  SmallPtrSetIteratorImpl local_48;
  void **local_38;
  undefined1 local_30;
  void **local_28;
  pair<const_void_*const_*,_bool> p;
  Option *Ptr_local;
  SmallPtrSetImpl<llvm::cl::Option_*> *this_local;
  
  p._8_8_ = Ptr;
  Ptr_00 = PointerLikeTypeTraits<llvm::cl::Option_*>::getAsVoidPointer(Ptr);
  pVar1 = SmallPtrSetImplBase::insert_imp(&this->super_SmallPtrSetImplBase,Ptr_00);
  local_38 = pVar1.first;
  local_30 = pVar1.second;
  local_28 = local_38;
  p.first._0_1_ = local_30;
  local_48 = (SmallPtrSetIteratorImpl)makeIterator(this,local_38);
  std::make_pair<llvm::SmallPtrSetIterator<llvm::cl::Option*>,bool&>
            (__return_storage_ptr__,(SmallPtrSetIterator<llvm::cl::Option_*> *)&local_48,(bool *)&p)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> insert(PtrType Ptr) {
    auto p = insert_imp(PtrTraits::getAsVoidPointer(Ptr));
    return std::make_pair(makeIterator(p.first), p.second);
  }